

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O0

CURLcode ftp_dophase_done(Curl_easy *data,_Bool connected)

{
  int local_3c;
  CURLcode result;
  int completed;
  ftp_conn *ftpc;
  FTP *ftp;
  connectdata *conn;
  Curl_easy *pCStack_18;
  _Bool connected_local;
  Curl_easy *data_local;
  
  ftp = (FTP *)data->conn;
  ftpc = (ftp_conn *)(data->req).p.file;
  _result = &((connectdata *)ftp)->proto;
  conn._7_1_ = connected;
  pCStack_18 = data;
  if ((connected) && (data_local._4_4_ = ftp_do_more(data,&local_3c), data_local._4_4_ != CURLE_OK))
  {
    close_secondarysocket(pCStack_18,(connectdata *)ftp);
  }
  else {
    if ((int)(ftpc->pp).nread_resp == 0) {
      if ((conn._7_1_ & 1) == 0) {
        *(uint *)&ftp[0x1b].field_0x14 = *(uint *)&ftp[0x1b].field_0x14 & 0xffffdfff | 0x2000;
      }
    }
    else {
      Curl_setup_transfer(pCStack_18,-1,-1,false,-1);
    }
    (_result->ftpc).ctl_valid = true;
    data_local._4_4_ = CURLE_OK;
  }
  return data_local._4_4_;
}

Assistant:

static CURLcode ftp_dophase_done(struct Curl_easy *data, bool connected)
{
  struct connectdata *conn = data->conn;
  struct FTP *ftp = data->req.p.ftp;
  struct ftp_conn *ftpc = &conn->proto.ftpc;

  if(connected) {
    int completed;
    CURLcode result = ftp_do_more(data, &completed);

    if(result) {
      close_secondarysocket(data, conn);
      return result;
    }
  }

  if(ftp->transfer != PPTRANSFER_BODY)
    /* no data to transfer */
    Curl_setup_transfer(data, -1, -1, FALSE, -1);
  else if(!connected)
    /* since we didn't connect now, we want do_more to get called */
    conn->bits.do_more = TRUE;

  ftpc->ctl_valid = TRUE; /* seems good */

  return CURLE_OK;
}